

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O0

HANDLE CreateSemaphoreW(LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,LONG lInitialCount,
                       LONG lMaximumCount,LPCWSTR lpName)

{
  PAL_ERROR dwLastError;
  CPalThread *pthr_00;
  CPalThread *pthr;
  HANDLE pVStack_28;
  PAL_ERROR palError;
  HANDLE hSemaphore;
  LPCWSTR lpName_local;
  LONG lMaximumCount_local;
  LONG lInitialCount_local;
  LPSECURITY_ATTRIBUTES lpSemaphoreAttributes_local;
  
  pVStack_28 = (HANDLE)0x0;
  hSemaphore = lpName;
  lpName_local._0_4_ = lMaximumCount;
  lpName_local._4_4_ = lInitialCount;
  _lMaximumCount_local = lpSemaphoreAttributes;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pthr_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalCreateSemaphore
                          (pthr_00,_lMaximumCount_local,lpName_local._4_4_,(LONG)lpName_local,
                           (LPCWSTR)hSemaphore,&stack0xffffffffffffffd8);
  CorUnix::CPalThread::SetLastError(dwLastError);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return pVStack_28;
}

Assistant:

HANDLE
PALAPI
CreateSemaphoreW(
         IN LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,
         IN LONG lInitialCount,
         IN LONG lMaximumCount,
         IN LPCWSTR lpName)
{
    HANDLE hSemaphore = NULL;
    PAL_ERROR palError;
    CPalThread *pthr = NULL;

    PERF_ENTRY(CreateSemaphoreW);
    ENTRY("CreateSemaphoreW(lpSemaphoreAttributes=%p, lInitialCount=%d, "
          "lMaximumCount=%d, lpName=%p (%S))\n",
          lpSemaphoreAttributes, lInitialCount, lMaximumCount,
          lpName, lpName?lpName:W16_NULLSTRING);

    pthr = InternalGetCurrentThread();

    palError = InternalCreateSemaphore(
        pthr,
        lpSemaphoreAttributes,
        lInitialCount,
        lMaximumCount,
        lpName,
        &hSemaphore
        );

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pthr->SetLastError(palError);

    LOGEXIT("CreateSemaphoreW returns HANDLE %p\n", hSemaphore);
    PERF_EXIT(CreateSemaphoreW);
    return hSemaphore;
}